

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testTranslationRotationMatrix<double>(M44d *mat)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  double a_00;
  double b_00;
  double c;
  V3d b2;
  V3d b1;
  V3d b_1;
  V3d a_1;
  size_t i_1;
  double eps;
  M44d m2;
  M44d m1;
  vector<double,_std::allocator<double>_> weights;
  V3d b;
  V3d a;
  size_t i;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  size_t numPoints;
  value_type *in_stack_fffffffffffffcf8;
  Vec3<double> *in_stack_fffffffffffffd00;
  Vec3<double> *in_stack_fffffffffffffd08;
  value_type_conflict2 *in_stack_fffffffffffffd10;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *this;
  size_type in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  size_type in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  Matrix44<double> *in_stack_fffffffffffffde0;
  Vec3<double> *in_stack_fffffffffffffde8;
  Vec3<double> local_208;
  size_type local_1f0;
  undefined8 local_1e8;
  Vec3 local_1e0 [24];
  Matrix44<double> *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  Vec3 local_160 [136];
  undefined8 local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  Vec3<double> local_b8;
  Vec3<double> local_a0;
  Vec3<double> local_88;
  Vec3<double> local_70;
  ulong local_58;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_50;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_38;
  ulong local_20;
  
  std::operator<<((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ");
  Imath_2_5::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (testTranslationRotationMatrix<double>(Imath_2_5::Matrix44<double>const&)::rand == '\0') {
    iVar1 = __cxa_guard_acquire(&testTranslationRotationMatrix<double>(Imath_2_5::Matrix44<double>const&)
                                 ::rand);
    if (iVar1 != 0) {
      Imath_2_5::Rand48::Rand48
                ((Rand48 *)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
      __cxa_guard_release(&testTranslationRotationMatrix<double>(Imath_2_5::Matrix44<double>const&)
                           ::rand);
    }
  }
  local_20 = 7;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x17b6fc)
  ;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::reserve
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38
            );
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x17b725)
  ;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::reserve
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38
            );
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    a_00 = Imath_2_5::Rand48::nextf((Rand48 *)0x17b767);
    b_00 = Imath_2_5::Rand48::nextf((Rand48 *)0x17b77b);
    c = Imath_2_5::Rand48::nextf((Rand48 *)0x17b78f);
    Imath_2_5::Vec3<double>::Vec3(&local_70,a_00,b_00,c);
    Imath_2_5::operator*(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    Imath_2_5::Vec3<double>::Vec3(&local_a0,&local_70);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    Imath_2_5::Vec3<double>::Vec3(&local_b8,&local_88);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  local_d8 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x17b8d6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_stack_fffffffffffffd18
             ,in_stack_fffffffffffffd10,(allocator_type *)in_stack_fffffffffffffd08);
  std::allocator<double>::~allocator((allocator<double> *)0x17b904);
  pvVar2 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
           operator[](&local_38,0);
  pvVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
           operator[](&local_50,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,0);
  Imath_2_5::procrustesRotationAndTranslation<double>
            (local_160,(Vec3 *)pvVar2,&pvVar3->x,(ulong)pvVar4,SUB81(local_20,0));
  this = (vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x0;
  pvVar2 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
           operator[](&local_38,0);
  pvVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
           operator[](&local_50,(size_type)this);
  Imath_2_5::procrustesRotationAndTranslation<double>
            (local_1e0,(Vec3 *)pvVar2,(ulong)pvVar3,SUB81(local_20,0));
  local_1e8 = 0x3e45798ee2308c3a;
  local_1f0 = 0;
  while( true ) {
    if (local_20 <= local_1f0) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector(this)
      ;
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector(this)
      ;
      return;
    }
    pvVar2 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_38,local_1f0);
    Imath_2_5::Vec3<double>::Vec3(&local_208,pvVar2);
    pvVar2 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_50,local_1f0);
    Imath_2_5::Vec3<double>::Vec3((Vec3<double> *)&stack0xfffffffffffffde0,pvVar2);
    Imath_2_5::operator*(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    Imath_2_5::operator*(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    Imath_2_5::Vec3<double>::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd08 =
         (Vec3<double> *)Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffd08);
    if (1e-08 <= (double)in_stack_fffffffffffffd08) break;
    Imath_2_5::Vec3<double>::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd00 =
         (Vec3<double> *)Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffd08);
    if (1e-08 <= (double)in_stack_fffffffffffffd00) {
      __assert_fail("(b - b2).length() < eps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                    ,0x54,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = double]"
                   );
    }
    local_1f0 = local_1f0 + 1;
  }
  __assert_fail("(b - b1).length() < eps",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                ,0x53,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = double]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t numPoints = 7;
    std::vector<Vec> from;  from.reserve (numPoints);
    std::vector<Vec> to;    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (rand.nextf(), rand.nextf(), rand.nextf());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec(a));
        to.push_back (Vec(b));
    }

    std::vector<T> weights (numPoints, T(1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 = procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof(T) == 8 ? 1e-8 : 1e-4;
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length() < eps);
        assert ((b - b2).length() < eps);
    }
    std::cout << "  OK\n";
}